

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScannerResolver.cpp
# Opt level: O1

XMLScanner *
xercesc_4_0::XMLScannerResolver::resolveScanner
          (XMLCh *scannerName,XMLValidator *valToAdopt,GrammarResolver *grammarResolver,
          MemoryManager *manager)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  WFXMLScanner *this;
  IGXMLScanner *this_00;
  SGXMLScanner *this_01;
  DGXMLScanner *this_02;
  XMLCh *pXVar4;
  
  if (scannerName == L"WFXMLScanner") {
LAB_002ca6a3:
    this = (WFXMLScanner *)XMemory::operator_new(0x3d0,manager);
    WFXMLScanner::WFXMLScanner(this,valToAdopt,grammarResolver,manager);
    return &this->super_XMLScanner;
  }
  pXVar3 = L"WFXMLScanner";
  pXVar4 = scannerName;
  if (scannerName == (XMLCh *)0x0) {
LAB_002ca667:
    if (*pXVar3 == L'\0') goto LAB_002ca6a3;
  }
  else {
    do {
      XVar1 = *pXVar4;
      if (XVar1 == L'\0') goto LAB_002ca667;
      XVar2 = *pXVar3;
      pXVar3 = pXVar3 + 1;
      pXVar4 = pXVar4 + 1;
    } while (XVar1 == XVar2);
  }
  if (scannerName == L"IGXMLScanner") {
LAB_002ca705:
    this_00 = (IGXMLScanner *)XMemory::operator_new(0x4b8,manager);
    IGXMLScanner::IGXMLScanner(this_00,valToAdopt,grammarResolver,manager);
    return &this_00->super_XMLScanner;
  }
  pXVar3 = L"IGXMLScanner";
  pXVar4 = scannerName;
  if (scannerName == (XMLCh *)0x0) {
LAB_002ca6c9:
    if (*pXVar3 == L'\0') goto LAB_002ca705;
  }
  else {
    do {
      XVar1 = *pXVar4;
      if (XVar1 == L'\0') goto LAB_002ca6c9;
      XVar2 = *pXVar3;
      pXVar3 = pXVar3 + 1;
      pXVar4 = pXVar4 + 1;
    } while (XVar1 == XVar2);
  }
  if (scannerName == L"SGXMLScanner") {
LAB_002ca763:
    this_01 = (SGXMLScanner *)XMemory::operator_new(0x4a8,manager);
    SGXMLScanner::SGXMLScanner(this_01,valToAdopt,grammarResolver,manager);
    return &this_01->super_XMLScanner;
  }
  pXVar3 = L"SGXMLScanner";
  pXVar4 = scannerName;
  if (scannerName == (XMLCh *)0x0) {
LAB_002ca72b:
    if (*pXVar3 == L'\0') goto LAB_002ca763;
  }
  else {
    do {
      XVar1 = *pXVar4;
      if (XVar1 == L'\0') goto LAB_002ca72b;
      XVar2 = *pXVar3;
      pXVar3 = pXVar3 + 1;
      pXVar4 = pXVar4 + 1;
    } while (XVar1 == XVar2);
  }
  if (scannerName != L"DGXMLScanner") {
    pXVar3 = L"DGXMLScanner";
    if (scannerName != (XMLCh *)0x0) {
      while (XVar1 = *scannerName, XVar1 != L'\0') {
        scannerName = scannerName + 1;
        XVar2 = *pXVar3;
        pXVar3 = pXVar3 + 1;
        if (XVar1 != XVar2) {
          return (XMLScanner *)0x0;
        }
      }
    }
    if (*pXVar3 != L'\0') {
      return (XMLScanner *)0x0;
    }
  }
  this_02 = (DGXMLScanner *)XMemory::operator_new(0x3d8,manager);
  DGXMLScanner::DGXMLScanner(this_02,valToAdopt,grammarResolver,manager);
  return &this_02->super_XMLScanner;
}

Assistant:

XMLScanner*
XMLScannerResolver::resolveScanner( const XMLCh* const   scannerName
                                  , XMLValidator* const  valToAdopt
                                  , GrammarResolver* const grammarResolver
                                  , MemoryManager* const manager)
{
    if (XMLString::equals(scannerName, XMLUni::fgWFXMLScanner))
        return new (manager) WFXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgIGXMLScanner))
        return new (manager) IGXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgSGXMLScanner))
        return new (manager) SGXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgDGXMLScanner))
        return new (manager) DGXMLScanner(valToAdopt, grammarResolver, manager);

    // REVISIT: throw an exception or return a default one?
    return 0;
}